

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void soundfiler_read(t_soundfiler *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  t_word *ptVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _garray *p_Var11;
  _binbuf *b;
  t_atom *ptVar12;
  int *piVar13;
  ulong uVar14;
  ssize_t sVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  uint *puVar23;
  uint *puVar24;
  long lVar25;
  t_atom *a;
  t_word **vec;
  char *pcVar26;
  ulong uVar27;
  t_float tVar28;
  t_soundfile sf;
  int vecsize_3;
  int vecsize_2;
  t_word *vecs [64];
  _garray *garrays [64];
  char sampbuf [1024];
  size_t local_8a8;
  t_soundfile local_898;
  int local_854;
  undefined8 local_850;
  char *local_848;
  ulong local_840;
  t_word *local_838 [64];
  undefined8 auStack_638 [64];
  uint local_438 [258];
  
  local_898.sf_bigendian = 0;
  local_898.sf_bytesperframe = 0;
  local_898.sf_samplerate = 0;
  local_898.sf_nchannels = 0;
  local_898.sf_bytespersample = 0;
  local_898._28_4_ = 0;
  local_898.sf_fd = -1;
  local_898._4_4_ = 0;
  local_898.sf_type = (t_soundfile_type *)0x0;
  local_898.sf_bytelimit = 0x7fffffffffffffff;
  local_898.sf_headersize = -1;
  local_840 = 0xffffffffffffffff;
  local_8a8 = 0;
  bVar8 = false;
  iVar10 = 0;
  bVar7 = false;
  do {
    if (((argc < 1) || (argv->a_type != A_SYMBOL)) ||
       (pcVar26 = ((argv->a_w).w_symbol)->s_name, *pcVar26 != '-')) {
      if (-1 < local_898.sf_headersize) {
        local_898.sf_type = (t_soundfile_type *)0x0;
        iVar10 = 0;
      }
      if ((0xffffffbe < argc - 0x42U) && (argv->a_type == A_SYMBOL)) {
        pcVar26 = ((argv->a_w).w_symbol)->s_name;
        if ((local_898.sf_headersize < 0) &&
           ((iVar10 == 0 && (local_898.sf_type == (t_soundfile_type *)0x0)))) {
          iVar10 = ascii_hasextension(pcVar26,(size_t)s);
        }
        uVar1 = argc - 1;
        local_848 = pcVar26;
        if (1 < argc) {
          lVar25 = 0;
          uVar27 = 0;
          goto LAB_0012aae9;
        }
        uVar27 = 0;
        goto LAB_0012abcc;
      }
      break;
    }
    pcVar26 = pcVar26 + 1;
    pcVar21 = "skip";
    iVar9 = strcmp(pcVar26,"skip");
    if (iVar9 == 0) {
      if (((argc == 1) || (argv[1].a_type != A_FLOAT)) || (fVar2 = argv[1].a_w.w_float, fVar2 < 0.0)
         ) goto LAB_0012aa2f;
      local_8a8 = (long)(fVar2 - 9.223372e+18) & (long)fVar2 >> 0x3f | (long)fVar2;
      argc = argc + -2;
      argv = argv + 2;
      bVar6 = true;
    }
    else {
      pcVar21 = "ascii";
      iVar9 = strcmp(pcVar26,"ascii");
      if (iVar9 == 0) {
        if (-1 < local_898.sf_headersize) {
          post("\'-ascii\' overridden by \'-raw\'");
        }
        argc = argc + -1;
        argv = argv + 1;
        bVar6 = true;
        iVar10 = 1;
      }
      else {
        pcVar21 = "raw";
        iVar9 = strcmp(pcVar26,"raw");
        if (iVar9 == 0) {
          if (iVar10 == 0) {
            if (local_898.sf_type != (t_soundfile_type *)0x0) {
              pcVar21 = (local_898.sf_type)->t_name;
              post("\'-%s\' overridden by \'-raw\'");
            }
          }
          else {
            post("\'-ascii\' overridden by \'-raw\'");
          }
          if ((((4 < argc) && (argv[1].a_type == A_FLOAT)) &&
              ((local_898.sf_headersize = (ssize_t)argv[1].a_w.w_float, -1 < local_898.sf_headersize
               && ((argv[2].a_type == A_FLOAT &&
                   (local_898.sf_nchannels = (int)argv[2].a_w.w_float,
                   0xffffffbf < local_898.sf_nchannels - 0x41U)))))) && (argv[3].a_type == A_FLOAT))
          {
            local_898.sf_bytespersample = (int)argv[3].a_w.w_float;
            if ((0xfffffffc < (int)argv[3].a_w.w_float - 5U) && (argv[4].a_type == A_SYMBOL)) {
              cVar3 = *(argv[4].a_w.w_symbol)->s_name;
              if ((cVar3 == 'n') || (cVar3 == 'l')) {
                local_898._40_8_ = (ulong)(uint)local_898.sf_bytesperframe << 0x20;
              }
              else {
                if (cVar3 != 'b') goto LAB_0012aa2f;
                local_898.sf_bigendian = 1;
              }
              tVar28 = sys_getsr();
              local_898.sf_samplerate = (int)tVar28;
              local_898.sf_bytesperframe = local_898.sf_bytespersample * local_898.sf_nchannels;
              argc = argc + -5;
              argv = argv + 5;
              bVar6 = true;
              bVar8 = true;
              goto LAB_0012aa31;
            }
          }
          goto LAB_0012aa2f;
        }
        pcVar21 = "resize";
        iVar9 = strcmp(pcVar26,"resize");
        if (iVar9 == 0) {
          argc = argc + -1;
          argv = argv + 1;
          bVar6 = true;
          bVar7 = true;
        }
        else {
          pcVar21 = "maxsize";
          iVar9 = strcmp(pcVar26,"maxsize");
          if (iVar9 == 0) {
            if (((argc == 1) || (argv[1].a_type != A_FLOAT)) ||
               (ptVar12 = argv + 1, (long)(ptVar12->a_w).w_float < 0)) goto LAB_0012aa2f;
            argc = argc + -2;
            argv = argv + 2;
            bVar6 = true;
            bVar7 = true;
            local_840 = (long)(ptVar12->a_w).w_float;
          }
          else {
            local_898.sf_type = soundfile_findtype(pcVar26);
            if (local_898.sf_type == (t_soundfile_type *)0x0) {
LAB_0012aa2f:
              bVar6 = false;
            }
            else {
              if (-1 < local_898.sf_headersize) {
                pcVar21 = (local_898.sf_type)->t_name;
                post("\'-%s\' overridden by \'-raw\'");
              }
              argc = argc + -1;
              argv = argv + 1;
              bVar6 = true;
              iVar10 = 0;
            }
          }
        }
      }
    }
LAB_0012aa31:
    s = (t_symbol *)pcVar21;
  } while (bVar6);
LAB_0012ac1e:
  pd_error(x,"usage: read [flags] filename [tablename]...");
  post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...",sf_typeargs);
  post("-raw <headerbytes> <channels> <bytespersample> <endian (b, l, or n)>");
LAB_0012ac59:
  iVar10 = -1;
  uVar27 = 0;
  goto LAB_0012ac5e;
  while (lVar25 = lVar25 + 8, (ulong)uVar1 << 3 != lVar25) {
LAB_0012aae9:
    iVar9 = 4;
    if (*(int *)((long)&argv[1].a_type + lVar25 * 2) == 2) {
      p_Var11 = (_garray *)
                pd_findbyclass(*(t_symbol **)((long)&argv[1].a_w + lVar25 * 2),garray_class);
      *(_garray **)((long)auStack_638 + lVar25) = p_Var11;
      if (p_Var11 == (_garray *)0x0) {
        pd_error(x,"soundfiler read: %s: no such table",
                 **(undefined8 **)((long)&argv[1].a_w + lVar25 * 2));
        iVar9 = 8;
      }
      else {
        iVar9 = garray_getfloatwords(p_Var11,(int *)local_438,(t_word **)((long)local_838 + lVar25))
        ;
        if (iVar9 == 0) {
          pd_error(x,"soundfiler read: %s: bad template for tabwrite",
                   **(undefined8 **)((long)&argv[1].a_w + lVar25 * 2));
        }
        if ((uVar27 != 0) && (!bVar7 && uVar27 != (long)(int)local_438[0])) {
          post("arrays have different lengths, resizing...");
          bVar7 = true;
        }
        uVar27 = (ulong)(int)local_438[0];
        iVar9 = 0;
      }
    }
    if (iVar9 != 0) {
      if (iVar9 == 4) goto LAB_0012ac1e;
      iVar10 = -1;
      uVar27 = 0;
      goto LAB_0012ac5e;
    }
  }
LAB_0012abcc:
  pcVar26 = local_848;
  if (iVar10 == 0) {
    iVar10 = open_soundfile_via_canvas(x->x_canvas,local_848,&local_898,local_8a8);
    uVar20 = local_840;
    if (-1 < iVar10) {
      uVar19 = local_898.sf_bytelimit / (long)local_898.sf_bytesperframe;
      if (bVar7) {
        if (local_840 < uVar19) {
          pd_error(x,"soundfiler read: truncated to %ld elements");
          uVar19 = uVar20;
        }
        uVar27 = uVar19;
        if (1 < argc) {
          lVar25 = 0;
          do {
            p_Var11 = *(_garray **)((long)auStack_638 + lVar25);
            garray_resize_long(p_Var11,uVar19);
            garray_setsaveit(p_Var11,0);
            iVar9 = garray_getfloatwords
                              (p_Var11,(int *)local_438,(t_word **)((long)local_838 + lVar25));
            if ((iVar9 == 0) || (uVar19 != (long)(int)local_438[0])) {
              uVar27 = 0;
              pd_error(x,"soundfiler read: resize failed");
              goto LAB_0012ac5e;
            }
            lVar25 = lVar25 + 8;
          } while ((ulong)uVar1 << 3 != lVar25);
        }
      }
      uVar27 = -(ulong)(uVar27 == 0) | uVar27;
      uVar20 = uVar19;
      if (uVar27 < uVar19) {
        uVar20 = uVar27;
      }
      if ((long)uVar19 < 0) {
        uVar20 = uVar27;
      }
      if (((uVar1 != 0) || (bVar8)) || (uVar27 = uVar20, uVar20 == 0xffffffffffffffff)) {
        uVar27 = 0;
        uVar19 = (ulong)(int)(0x400 / (long)local_898.sf_bytesperframe);
        do {
          uVar14 = uVar20 - uVar27;
          if (uVar20 < uVar27 || uVar14 == 0) break;
          if (uVar19 <= uVar14) {
            uVar14 = uVar19;
          }
          sVar15 = read(local_898.sf_fd,local_438,(long)local_898.sf_bytesperframe * uVar14);
          lVar25 = sVar15 / (long)local_898.sf_bytesperframe;
          if (0 < lVar25) {
            uVar17 = local_898.sf_nchannels;
            if ((int)uVar1 <= local_898.sf_nchannels) {
              uVar17 = uVar1;
            }
            if (0 < (int)uVar17) {
              uVar14 = 0;
              puVar23 = local_438;
              do {
                if (local_898.sf_bytespersample == 4) {
                  ptVar5 = local_838[uVar14];
                  if (local_898.sf_bigendian == 0) {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      ptVar5[uVar27 + lVar16].w_index = *puVar24;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                  else {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      uVar4 = *puVar24;
                      ptVar5[uVar27 + lVar16].w_index =
                           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                }
                else if (local_898.sf_bytespersample == 3) {
                  ptVar5 = local_838[uVar14];
                  if (local_898.sf_bigendian == 0) {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      ptVar5[uVar27 + lVar16].w_float =
                           (float)(int)((uint)(byte)*puVar24 << 8 |
                                       (uint)*(byte *)((long)puVar24 + 1) << 0x10 |
                                       (uint)*(byte *)((long)puVar24 + 2) << 0x18) * 4.656613e-10;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                  else {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      ptVar5[uVar27 + lVar16].w_float =
                           (float)(int)((uint)*(byte *)((long)puVar24 + 2) << 8 |
                                       (uint)*(byte *)((long)puVar24 + 1) << 0x10 |
                                       (uint)(byte)*puVar24 << 0x18) * 4.656613e-10;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                }
                else if (local_898.sf_bytespersample == 2) {
                  ptVar5 = local_838[uVar14];
                  if (local_898.sf_bigendian == 0) {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      ptVar5[uVar27 + lVar16].w_float =
                           (float)(int)((uint)(byte)*puVar24 << 0x10 |
                                       (uint)*(byte *)((long)puVar24 + 1) << 0x18) * 4.656613e-10;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                  else {
                    lVar16 = 0;
                    puVar24 = puVar23;
                    do {
                      ptVar5[uVar27 + lVar16].w_float =
                           (float)(int)((uint)*(byte *)((long)puVar24 + 1) << 0x10 |
                                       (uint)(byte)*puVar24 << 0x18) * 4.656613e-10;
                      lVar16 = lVar16 + 1;
                      puVar24 = (uint *)((long)puVar24 + (long)local_898.sf_bytesperframe);
                    } while (lVar25 != lVar16);
                  }
                }
                uVar14 = uVar14 + 1;
                puVar23 = (uint *)((long)puVar23 + (long)local_898.sf_bytespersample);
              } while (uVar14 != uVar17);
            }
            lVar16 = (long)local_898.sf_nchannels;
            if (local_898.sf_nchannels < (int)uVar1) {
              do {
                ptVar5 = local_838[lVar16];
                lVar22 = 0;
                do {
                  ptVar5[lVar22].w_float = 0.0;
                  lVar22 = lVar22 + 1;
                } while (lVar25 != lVar22);
                lVar16 = lVar16 + 1;
              } while (lVar16 != (int)uVar1);
            }
            uVar27 = uVar27 + lVar25;
          }
        } while (0 < lVar25);
        if ((bVar7) && (uVar27 < uVar20)) {
          post("warning: soundfile %s header promised %ld points but file was truncated to %ld",
               local_848,uVar20,uVar27);
        }
        if (1 < argc) {
          uVar20 = 0;
          do {
            iVar9 = garray_getfloatwords
                              ((_garray *)auStack_638[uVar20],(int *)&local_850,local_838 + uVar20);
            if ((iVar9 != 0) && (uVar19 = uVar27, uVar27 < (ulong)(long)(int)local_850)) {
              do {
                local_838[uVar20][uVar19].w_float = 0.0;
                uVar19 = uVar19 + 1;
              } while (uVar19 < (ulong)(long)(int)local_850);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar1);
        }
        lVar25 = (long)local_898.sf_nchannels;
        if (local_898.sf_nchannels < (int)uVar1) {
          do {
            iVar9 = garray_getfloatwords
                              ((_garray *)auStack_638[lVar25],&local_854,(t_word **)&local_850);
            if ((iVar9 != 0) && (local_854 != 0)) {
              uVar20 = 0;
              do {
                *(undefined4 *)(CONCAT44(local_850._4_4_,(int)local_850) + uVar20 * 8) = 0;
                uVar20 = uVar20 + 1;
              } while (uVar20 < (ulong)(long)local_854);
            }
            lVar25 = lVar25 + 1;
          } while (uVar1 != (uint)lVar25);
        }
        if (1 < argc) {
          uVar20 = 0;
          do {
            garray_redraw((_garray *)auStack_638[uVar20]);
            uVar20 = uVar20 + 1;
          } while (uVar1 != uVar20);
        }
      }
      goto LAB_0012ac5e;
    }
    piVar13 = __errno_location();
    object_sferror(x,"soundfiler read",pcVar26,*piVar13,&local_898);
    iVar9 = iVar10;
  }
  else {
    if (uVar1 == 0) {
      pd_error(x,"soundfiler read: \'-ascii\' requires at least one table");
      goto LAB_0012ac59;
    }
    b = binbuf_new();
    iVar10 = binbuf_read_via_canvas(b,pcVar26,x->x_canvas,0);
    if (iVar10 == 0) {
      ptVar12 = binbuf_getvec(b);
      iVar10 = binbuf_getnatom(b);
      uVar20 = local_840;
      if (iVar10 / (int)uVar1 < 1) {
        iVar18 = 0;
        pd_error(x,"soundfiler read: %s: empty or very short ascii file",pcVar26);
      }
      else {
        uVar19 = (ulong)(iVar10 / (int)uVar1);
        if (bVar7) {
          if (local_840 < uVar19) {
            pd_error(x,"soundfiler read: truncated to %ld elements");
            uVar19 = uVar20;
          }
          uVar20 = uVar19 - local_8a8;
          if (1 < argc) {
            vec = local_838;
            lVar25 = 0;
            do {
              p_Var11 = (_garray *)auStack_638[lVar25];
              garray_resize_long(p_Var11,uVar20);
              garray_setsaveit(p_Var11,0);
              iVar10 = garray_getfloatwords(p_Var11,(int *)local_438,vec);
              if ((iVar10 == 0) || (uVar20 != (long)(int)local_438[0])) {
                iVar18 = 0;
                pd_error(x,"soundfiler read: resize failed");
                goto LAB_0012b444;
              }
              lVar25 = lVar25 + 1;
              vec = vec + 1;
            } while ((int)uVar1 != lVar25);
          }
        }
        else {
          uVar20 = uVar19 - local_8a8;
          if ((long)uVar27 <= (long)uVar19) {
            uVar20 = uVar27;
          }
        }
        if (0 < (long)uVar20) {
          uVar19 = 0;
          uVar27 = local_8a8 * (long)(int)uVar1;
          if ((long)local_8a8 < 1) {
            uVar27 = uVar19;
          }
          ptVar12 = ptVar12 + uVar27;
          do {
            if (1 < argc) {
              lVar25 = 0;
              a = ptVar12;
              do {
                ptVar12 = a + 1;
                tVar28 = atom_getfloat(a);
                local_838[lVar25][uVar19].w_float = tVar28;
                lVar25 = lVar25 + 1;
                a = ptVar12;
              } while ((int)uVar1 != lVar25);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar20);
        }
        iVar18 = (int)uVar20;
        if (1 < argc) {
          lVar25 = 0;
          do {
            iVar10 = garray_getfloatwords
                               ((_garray *)auStack_638[lVar25],(int *)local_438,local_838 + lVar25);
            if ((iVar10 != 0) && (lVar16 = (long)iVar18, iVar18 < (int)local_438[0])) {
              do {
                local_838[lVar25][lVar16].w_float = 0.0;
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)local_438[0]);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != (int)uVar1);
          if (1 < argc) {
            lVar25 = 0;
            do {
              garray_redraw((_garray *)auStack_638[lVar25]);
              lVar25 = lVar25 + 1;
            } while ((int)uVar1 != lVar25);
          }
        }
      }
    }
    else {
      iVar18 = 0;
    }
LAB_0012b444:
    binbuf_free(b);
    iVar10 = -1;
    iVar9 = -1;
    if (iVar18 != 0) {
      tVar28 = sys_getsr();
      local_898.sf_samplerate = (int)tVar28;
      local_898.sf_headersize = 0;
      local_898.sf_bytespersample = 4;
      local_898._40_8_ = local_898._40_8_ & 0xffffffff00000000;
      uVar27 = (long)iVar18;
      local_898.sf_nchannels = uVar1;
      goto LAB_0012ac5e;
    }
  }
  iVar10 = iVar9;
  uVar27 = 0;
LAB_0012ac5e:
  local_898.sf_fd = -1;
  if (-1 < iVar10) {
    sys_close(iVar10);
  }
  outlet_soundfileinfo(x->x_out2,&local_898);
  outlet_float((x->x_obj).te_outlet,(float)uVar27);
  return;
}

Assistant:

static void soundfiler_read(t_soundfiler *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_soundfile sf = {0};
    int fd = -1, resize = 0, ascii = 0, raw = 0, i;
    size_t skipframes = 0, finalsize = 0, maxsize = SFMAXFRAMES,
           framesread = 0, bufframes, j;
    ssize_t nframes, framesinfile;
    char endianness;
    const char *filename;
    t_garray *garrays[MAXSFCHANS];
    t_word *vecs[MAXSFCHANS];
    char sampbuf[SAMPBUFSIZE];

    soundfile_clear(&sf);
    sf.sf_headersize = -1;
    while (argc > 0 && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name + 1;
        if (!strcmp(flag, "skip"))
        {
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                (argv[1].a_w.w_float) < 0)
                    goto usage;
            skipframes = argv[1].a_w.w_float;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(flag, "ascii"))
        {
            if (sf.sf_headersize >= 0)
                post("'-ascii' overridden by '-raw'");
            ascii = 1;
            argc--; argv++;
        }
        else if (!strcmp(flag, "raw"))
        {
            if (ascii)
                post("'-ascii' overridden by '-raw'");
            else if (sf.sf_type)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            if (argc < 5 ||
                argv[1].a_type != A_FLOAT ||
                ((sf.sf_headersize = argv[1].a_w.w_float) < 0) ||
                argv[2].a_type != A_FLOAT ||
                ((sf.sf_nchannels = argv[2].a_w.w_float) < 1) ||
                (sf.sf_nchannels > MAXSFCHANS) ||
                argv[3].a_type != A_FLOAT ||
                ((sf.sf_bytespersample = argv[3].a_w.w_float) < 2) ||
                    (sf.sf_bytespersample > 4) ||
                argv[4].a_type != A_SYMBOL ||
                    ((endianness = argv[4].a_w.w_symbol->s_name[0]) != 'b'
                    && endianness != 'l' && endianness != 'n'))
                        goto usage;
            if (endianness == 'b')
                sf.sf_bigendian = 1;
            else if (endianness == 'l')
                sf.sf_bigendian = 0;
            else
                sf.sf_bigendian = sys_isbigendian();
            sf.sf_samplerate = sys_getsr();
            sf.sf_bytesperframe = sf.sf_nchannels * sf.sf_bytespersample;
            raw = 1;
            argc -= 5; argv += 5;
        }
        else if (!strcmp(flag, "resize"))
        {
            resize = 1;
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "maxsize"))
        {
            ssize_t tmp;
            if (argc < 2 || argv[1].a_type != A_FLOAT ||
                ((tmp = (argv[1].a_w.w_float > SFMAXFRAMES ?
                SFMAXFRAMES : argv[1].a_w.w_float)) < 0))
                    goto usage;
            maxsize = (size_t)tmp;
            resize = 1;     /* maxsize implies resize */
            argc -= 2; argv += 2;
        }
        else
        {
                /* check for type by name */
            if (!(sf.sf_type = soundfile_findtype(flag)))
                goto usage; /* unknown flag */
            ascii = 0; /* replaced */
            if (sf.sf_headersize >= 0)
                post("'-%s' overridden by '-raw'", sf.sf_type->t_name);
            argc -= 1; argv += 1;
        }
    }
    if (sf.sf_headersize >= 0)
    {
        ascii = 0;
        sf.sf_type = NULL;
    }
    if (argc < 1 ||                           /* no filename or tables */
        argc > MAXSFCHANS + 1 ||              /* too many tables */
        argv[0].a_type != A_SYMBOL)           /* bad filename */
            goto usage;
    filename = argv[0].a_w.w_symbol->s_name;
    argc--; argv++;

        /* check for implicit ascii */
    if (!ascii && !sf.sf_type && sf.sf_headersize < 0)
        ascii = ascii_hasextension(filename, MAXPDSTRING);

    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (argv[i].a_type != A_SYMBOL)
            goto usage;
        if (!(garrays[i] =
            (t_garray *)pd_findbyclass(argv[i].a_w.w_symbol, garray_class)))
        {
            pd_error(x, "soundfiler read: %s: no such table",
                argv[i].a_w.w_symbol->s_name);
            goto done;
        }
        else if (!garray_getfloatwords(garrays[i], &vecsize,
                &vecs[i]))
            pd_error(x, "soundfiler read: %s: bad template for tabwrite",
                argv[i].a_w.w_symbol->s_name);
        if (finalsize && finalsize != (size_t)vecsize && !resize)
        {
            post("arrays have different lengths, resizing...");
            resize = 1;
        }
        finalsize = vecsize;
    }
    if (ascii)
    {
        t_asciiargs a =
            {skipframes, finalsize, argc, vecs, garrays, resize, maxsize, 0};
        if (!argc)
        {
            pd_error(x, "soundfiler read: "
                        "'-ascii' requires at least one table");
            goto done;
        }
        if ((framesread = soundfiler_readascii(x, filename, &a)) == 0)
            goto done;
            /* fill in for info outlet */
        sf.sf_samplerate = sys_getsr();
        sf.sf_headersize = 0;
        sf.sf_nchannels = argc;
        sf.sf_bytespersample = 4;
        sf.sf_bigendian = sys_isbigendian();
        goto done;
    }

    fd = open_soundfile_via_canvas(x->x_canvas, filename, &sf, skipframes);
    if (fd < 0)
    {
        object_sferror(x, "soundfiler read", filename, errno, &sf);
        goto done;
    }
    framesinfile = sf.sf_bytelimit / sf.sf_bytesperframe;

    if (resize)
    {
            /* figure out what to resize to using header info */
        if ((size_t)framesinfile > maxsize)
        {
            pd_error(x, "soundfiler read: truncated to %ld elements",
                (long)maxsize);
            framesinfile = maxsize;
        }
        finalsize = framesinfile;
        for (i = 0; i < argc; i++)
        {
            int vecsize;
            garray_resize_long(garrays[i], finalsize);
                /* for sanity's sake let's clear the save-in-patch flag here */
            garray_setsaveit(garrays[i], 0);
            if (!garray_getfloatwords(garrays[i], &vecsize, &vecs[i])
                /* if the resize failed, garray_resize reported the error */
                || (vecsize != framesinfile))
            {
                pd_error(x, "soundfiler read: resize failed");
                goto done;
            }
        }
    }

    if (!finalsize) finalsize = SFMAXFRAMES;
    if (framesinfile >= 0 && finalsize > (size_t)framesinfile)
        finalsize = framesinfile;

        /* no tablenames, try to use header info instead of reading */
    if (argc == 0 &&
        !(raw ||                     /* read if raw */
          finalsize == SFMAXFRAMES)) /* read if unknown size */
    {
        framesread = finalsize;
#ifdef DEBUG_SOUNDFILE
    post("skipped reading frames");
#endif
        goto done;
    }

        /* read */
#ifdef DEBUG_SOUNDFILE
    post("reading frames");
#endif
    bufframes = SAMPBUFSIZE / sf.sf_bytesperframe;
    for (framesread = 0; framesread < finalsize;)
    {
        size_t thisread = finalsize - framesread;
        thisread = (thisread > bufframes ? bufframes : thisread);
        nframes = read(sf.sf_fd, sampbuf,
            thisread * sf.sf_bytesperframe) / sf.sf_bytesperframe;
        if (nframes <= 0) break;
        soundfile_xferin_words(&sf, argc, vecs, framesread,
            (unsigned char *)sampbuf, nframes);
        framesread += nframes;
    }
        /* warn if a file's bad size field is gobbling memory */
    if (resize && framesread < (size_t)finalsize)
    {
        post("warning: soundfile %s header promised \
%ld points but file was truncated to %ld",
            filename, (long)finalsize, (long)framesread);
    }
        /* zero out remaining elements of vectors */
    for (i = 0; i < argc; i++)
    {
        int vecsize;
        if (garray_getfloatwords(garrays[i], &vecsize, &vecs[i]))
            for (j = framesread; j < (size_t)vecsize; j++)
                vecs[i][j].w_float = 0;
    }
        /* zero out vectors in excess of number of channels */
    for (i = sf.sf_nchannels; i < argc; i++)
    {
        int vecsize;
        t_word *foo;
        if (garray_getfloatwords(garrays[i], &vecsize, &foo))
            for (j = 0; j < (size_t)vecsize; j++)
                foo[j].w_float = 0;
    }
        /* do all graphics updates */
    for (i = 0; i < argc; i++)
        garray_redraw(garrays[i]);
    goto done;
usage:
    pd_error(x, "usage: read [flags] filename [tablename]...");
    post("flags: -skip <n> -resize -maxsize <n> %s -ascii ...", sf_typeargs);
    post("-raw <headerbytes> <channels> <bytespersample> "
         "<endian (b, l, or n)>");
done:
    sf.sf_fd = -1;
    if (fd >= 0)
        sys_close(fd);
    outlet_soundfileinfo(x->x_out2, &sf);
    outlet_float(x->x_obj.ob_outlet, (t_float)framesread);
}